

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

void __thiscall trieste::detail::Make::add(Make *this,Token *type,size_t index)

{
  size_t type_00;
  bool bVar1;
  element_type *this_00;
  Location *pLVar2;
  byte local_75;
  Location local_68;
  size_t local_20;
  size_t index_local;
  Token *type_local;
  Make *this_local;
  
  local_20 = index;
  index_local = (size_t)type;
  type_local = (Token *)this;
  Token::Token((Token *)&stack0xffffffffffffffd8,(TokenDef *)Group);
  bVar1 = Token::operator!=(type,(Token *)&stack0xffffffffffffffd8);
  local_75 = 0;
  if (bVar1) {
    Token::Token((Token *)&stack0xffffffffffffffd0,(TokenDef *)Group);
    bVar1 = in(this,(Token *)&stack0xffffffffffffffd0);
    local_75 = bVar1 ^ 0xff;
  }
  if ((local_75 & 1) != 0) {
    Token::Token((Token *)&stack0xffffffffffffffc8,(TokenDef *)Group);
    push(this,(Token *)&stack0xffffffffffffffc8,0);
  }
  this_00 = CLI::std::
            __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->node);
  type_00 = index_local;
  pLVar2 = REMatch::at(&this->re_match,local_20);
  Location::Location(&local_68,pLVar2);
  NodeDef::create((NodeDef *)&stack0xffffffffffffffb8,(Token *)type_00,&local_68);
  NodeDef::push_back(this_00,(Node *)&stack0xffffffffffffffb8);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr
            ((shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffb8);
  Location::~Location(&local_68);
  return;
}

Assistant:

void add(const Token& type, size_t index = 0)
      {
        if ((type != Group) && !in(Group))
          push(Group);

        node->push_back(NodeDef::create(type, re_match.at(index)));
      }